

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::EscapeChars_abi_cxx11_
                   (char *str,char *chars_to_escape,char escape_char)

{
  char in_CL;
  char *in_RDX;
  char *in_RSI;
  string *in_RDI;
  char *ptr;
  string *n;
  char *local_38;
  char *local_10;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (in_RSI != (char *)0x0) {
    if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
      std::__cxx11::string::append((char *)in_RDI);
    }
    else {
      strlen(in_RSI);
      std::__cxx11::string::reserve((ulong)in_RDI);
      for (local_10 = in_RSI; local_38 = in_RDX, *local_10 != '\0'; local_10 = local_10 + 1) {
        for (; *local_38 != '\0'; local_38 = local_38 + 1) {
          if (*local_10 == *local_38) {
            std::__cxx11::string::operator+=((string *)in_RDI,in_CL);
            break;
          }
        }
        std::__cxx11::string::operator+=((string *)in_RDI,*local_10);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::EscapeChars(const char* str,
                                     const char* chars_to_escape,
                                     char escape_char)
{
  std::string n;
  if (str) {
    if (!chars_to_escape || !*chars_to_escape) {
      n.append(str);
    } else {
      n.reserve(strlen(str));
      while (*str) {
        const char* ptr = chars_to_escape;
        while (*ptr) {
          if (*str == *ptr) {
            n += escape_char;
            break;
          }
          ++ptr;
        }
        n += *str;
        ++str;
      }
    }
  }
  return n;
}